

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_table_calculation.cpp
# Opt level: O1

void __thiscall
ParseTableCalculation::ParseTableCalculation
          (ParseTableCalculation *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *rules,bool print_debug)

{
  long lVar1;
  iterator __position;
  int iVar2;
  pointer pvVar3;
  vector<int,std::allocator<int>> *this_00;
  int local_2c;
  
  this->print_debug_ = print_debug;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->rules_,rules);
  (this->non_terminal_to_rule_indices_)._M_h._M_buckets =
       &(this->non_terminal_to_rule_indices_)._M_h._M_single_bucket;
  (this->non_terminal_to_rule_indices_)._M_h._M_bucket_count = 1;
  (this->non_terminal_to_rule_indices_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->non_terminal_to_rule_indices_)._M_h._M_element_count = 0;
  (this->non_terminal_to_rule_indices_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->non_terminal_to_rule_indices_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->non_terminal_to_rule_indices_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->non_terminal_first_sets_)._M_h._M_buckets =
       &(this->non_terminal_first_sets_)._M_h._M_single_bucket;
  (this->non_terminal_first_sets_)._M_h._M_bucket_count = 1;
  (this->non_terminal_first_sets_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->non_terminal_first_sets_)._M_h._M_element_count = 0;
  (this->non_terminal_first_sets_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->non_terminal_first_sets_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->non_terminal_first_sets_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pvVar3 = (this->rules_).
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = *(long *)&(pvVar3->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data;
  if ((long)*(pointer *)
             ((long)&(pvVar3->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data + 8) - lVar1 != 0x60) {
    __assert_fail("rules_.front().size() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/matej-svejda[P]script2000/src/parse_table_calculation.cpp"
                  ,0xb,
                  "ParseTableCalculation::ParseTableCalculation(const std::vector<std::vector<std::string>> &, bool)"
                 );
  }
  iVar2 = std::__cxx11::string::compare((char *)(lVar1 + 0x40));
  if (iVar2 == 0) {
    local_2c = 0;
    pvVar3 = (this->rules_).
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->rules_).
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) >> 3) *
            -0x55555555) {
      do {
        this_00 = (vector<int,std::allocator<int>> *)
                  std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->non_terminal_to_rule_indices_,
                               pvVar3[local_2c].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        __position._M_current = *(int **)(this_00 + 8);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position,&local_2c);
        }
        else {
          *__position._M_current = local_2c;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
        local_2c = local_2c + 1;
        pvVar3 = (this->rules_).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar2 = (int)((ulong)((long)(this->rules_).
                                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) >> 3)
        ;
      } while (SBORROW4(local_2c,iVar2 * -0x55555555) != local_2c + iVar2 * 0x55555555 < 0);
    }
    return;
  }
  __assert_fail("rules_.front()[2] == \"EOF\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/matej-svejda[P]script2000/src/parse_table_calculation.cpp"
                ,0xc,
                "ParseTableCalculation::ParseTableCalculation(const std::vector<std::vector<std::string>> &, bool)"
               );
}

Assistant:

ParseTableCalculation::ParseTableCalculation(const std::vector<std::vector<std::string>>& rules, bool print_debug)
	: print_debug_(print_debug),
	  rules_(rules)
{
	assert(rules_.front().size() == 3);
	assert(rules_.front()[2] == "EOF");

	for (int i = 0; i < static_cast<int>(rules_.size()); ++i)
	{
		non_terminal_to_rule_indices_[rules_[i].front()].push_back(i);
	}
}